

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

SmallVectorBase<slang::ast::OpaqueInstancePath::Entry> * __thiscall
slang::SmallVectorBase<slang::ast::OpaqueInstancePath::Entry>::operator=
          (SmallVectorBase<slang::ast::OpaqueInstancePath::Entry> *this,
          SmallVectorBase<slang::ast::OpaqueInstancePath::Entry> *rhs)

{
  ulong uVar1;
  ulong uVar2;
  size_type sVar3;
  pointer pEVar4;
  long lVar5;
  size_type sVar6;
  pointer pEVar7;
  
  if (this == rhs) {
    return this;
  }
  pEVar7 = rhs->data_;
  if (pEVar7 != (pointer)rhs->firstElement) {
    if (this->data_ != (pointer)this->firstElement) {
      operator_delete(this->data_);
      pEVar7 = rhs->data_;
    }
    rhs->data_ = (pointer)0x0;
    this->data_ = pEVar7;
    sVar6 = rhs->len;
    rhs->len = 0;
    this->len = sVar6;
    sVar6 = rhs->cap;
    rhs->cap = 0;
    this->cap = sVar6;
    return this;
  }
  uVar1 = this->len;
  uVar2 = rhs->len;
  if (uVar1 < uVar2) {
    if (this->cap < uVar2) {
      this->len = 0;
      reserve(this,rhs->len);
    }
    else if (uVar1 != 0) {
      memmove(this->data_,pEVar7,uVar1 << 3);
    }
    sVar3 = rhs->len;
    sVar6 = this->len;
    if (sVar6 == sVar3) goto LAB_0082186c;
    pEVar7 = rhs->data_;
    pEVar4 = this->data_;
    lVar5 = sVar6 << 3;
    do {
      *(undefined8 *)((long)&pEVar4->value + lVar5) = *(undefined8 *)((long)&pEVar7->value + lVar5);
      lVar5 = lVar5 + 8;
    } while (sVar3 << 3 != lVar5);
  }
  else {
    if (uVar2 == 0) {
      sVar6 = 0;
      goto LAB_0082186c;
    }
    memmove(this->data_,pEVar7,uVar2 << 3);
  }
  sVar6 = rhs->len;
LAB_0082186c:
  this->len = sVar6;
  rhs->len = 0;
  return this;
}

Assistant:

SmallVectorBase<T>& SmallVectorBase<T>::operator=(SmallVectorBase<T>&& rhs) {
    if (this == &rhs)
        return *this;

    // If the rhs isn't small, clear this vector and then steal its buffer.
    if (!rhs.isSmall()) {
        cleanup();
        this->data_ = std::exchange(rhs.data_, nullptr);
        this->len = std::exchange(rhs.len, 0);
        this->cap = std::exchange(rhs.cap, 0);
        return *this;
    }

    // If we already have sufficient space assign the common elements,
    // then destroy any excess.
    if (len >= rhs.size()) {
        iterator newEnd;
        if (rhs.size())
            newEnd = std::ranges::move(rhs, begin()).out;
        else
            newEnd = begin();

        std::ranges::destroy(newEnd, end());
        len = rhs.size();
        rhs.clear();
        return *this;
    }

    if (capacity() < rhs.size()) {
        // If we have to grow to have enough elements, destroy the current elements.
        // This allows us to avoid copying them during the grow.
        clear();
        reserve(rhs.size());
    }
    else if (len) {
        // Otherwise, use assignment for the already-constructed elements.
        std::ranges::move(rhs.begin(), rhs.begin() + len, begin());
    }

    // Move construct the new elements in place.
    std::uninitialized_move(rhs.begin() + len, rhs.end(), begin() + len);
    len = rhs.size();
    rhs.clear();
    return *this;
}